

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_53f39::OpenXrProgram::RenderFrame(OpenXrProgram *this)

{
  bool bVar1;
  XrResult XVar2;
  element_type *peVar3;
  size_type sVar4;
  undefined8 uStack_128;
  XrFrameEndInfo frameEndInfo;
  value_type local_f8;
  undefined1 local_f0 [8];
  vector<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
  projectionLayerViews;
  XrCompositionLayerProjection layer;
  vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_> layers;
  XrFrameBeginInfo frameBeginInfo;
  XrFrameState frameState;
  XrFrameWaitInfo frameWaitInfo;
  allocator local_31;
  string local_30 [32];
  OpenXrProgram *local_10;
  OpenXrProgram *this_local;
  
  local_10 = this;
  if (this->m_session != (XrSession)0x0) {
    frameState.shouldRender = 0x21;
    frameState._36_4_ = 0;
    memset(&frameBeginInfo.next,0,0x28);
    frameBeginInfo.next._0_4_ = 0x2c;
    XVar2 = xrWaitFrame(this->m_session,&frameState.shouldRender,&frameBeginInfo.next);
    CheckXrResult(XVar2,"xrWaitFrame(m_session, &frameWaitInfo, &frameState)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:870"
                 );
    layers.
    super__Vector_base<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2e;
    frameBeginInfo.type = XR_TYPE_UNKNOWN;
    frameBeginInfo._4_4_ = 0;
    XVar2 = xrBeginFrame(this->m_session,
                         &layers.
                          super__Vector_base<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    CheckXrResult(XVar2,"xrBeginFrame(m_session, &frameBeginInfo)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:873"
                 );
    std::vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>::
    vector((vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
            *)&layer.views);
    memset(&projectionLayerViews.
            super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x30);
    projectionLayerViews.
    super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x23;
    std::vector<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
    ::vector((vector<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
              *)local_f0);
    if (((int)frameState.predictedDisplayPeriod == 1) &&
       (bVar1 = RenderLayer(this,(XrTime)frameState.next,
                            (vector<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                             *)local_f0,
                            (XrCompositionLayerProjection *)
                            &projectionLayerViews.
                             super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
      local_f8 = (value_type)
                 &projectionLayerViews.
                  super__Vector_base<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>::
      push_back((vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
                 *)&layer.views,&local_f8);
    }
    frameEndInfo.displayTime = 0;
    frameEndInfo.type = XR_TYPE_UNKNOWN;
    frameEndInfo._4_4_ = 0;
    frameEndInfo.environmentBlendMode = 0;
    frameEndInfo.layerCount = 0;
    uStack_128 = 0xc;
    frameEndInfo.next = frameState.next;
    peVar3 = std::__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_options);
    frameEndInfo.displayTime =
         CONCAT44(frameEndInfo.displayTime._4_4_,(peVar3->Parsed).EnvironmentBlendMode);
    sVar4 = std::
            vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
            ::size((vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
                    *)&layer.views);
    frameEndInfo.displayTime = CONCAT44((int)sVar4,(undefined4)frameEndInfo.displayTime);
    frameEndInfo._24_8_ =
         std::
         vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>::
         data((vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
               *)&layer.views);
    XVar2 = xrEndFrame(this->m_session,&uStack_128);
    CheckXrResult(XVar2,"xrEndFrame(m_session, &frameEndInfo)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:889"
                 );
    std::vector<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
    ::~vector((vector<XrCompositionLayerProjectionView,_std::allocator<XrCompositionLayerProjectionView>_>
               *)local_f0);
    std::vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>::
    ~vector((vector<XrCompositionLayerBaseHeader_*,_std::allocator<XrCompositionLayerBaseHeader_*>_>
             *)&layer.views);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Check failed",&local_31);
  Throw((string *)local_30,"m_session != XR_NULL_HANDLE",
        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:866"
       );
}

Assistant:

void RenderFrame() override {
        CHECK(m_session != XR_NULL_HANDLE);

        XrFrameWaitInfo frameWaitInfo{XR_TYPE_FRAME_WAIT_INFO};
        XrFrameState frameState{XR_TYPE_FRAME_STATE};
        CHECK_XRCMD(xrWaitFrame(m_session, &frameWaitInfo, &frameState));

        XrFrameBeginInfo frameBeginInfo{XR_TYPE_FRAME_BEGIN_INFO};
        CHECK_XRCMD(xrBeginFrame(m_session, &frameBeginInfo));

        std::vector<XrCompositionLayerBaseHeader*> layers;
        XrCompositionLayerProjection layer{XR_TYPE_COMPOSITION_LAYER_PROJECTION};
        std::vector<XrCompositionLayerProjectionView> projectionLayerViews;
        if (frameState.shouldRender == XR_TRUE) {
            if (RenderLayer(frameState.predictedDisplayTime, projectionLayerViews, layer)) {
                layers.push_back(reinterpret_cast<XrCompositionLayerBaseHeader*>(&layer));
            }
        }

        XrFrameEndInfo frameEndInfo{XR_TYPE_FRAME_END_INFO};
        frameEndInfo.displayTime = frameState.predictedDisplayTime;
        frameEndInfo.environmentBlendMode = m_options->Parsed.EnvironmentBlendMode;
        frameEndInfo.layerCount = (uint32_t)layers.size();
        frameEndInfo.layers = layers.data();
        CHECK_XRCMD(xrEndFrame(m_session, &frameEndInfo));
    }